

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O0

size_t lddmc_nodecount_mark(MDD mdd)

{
  uint8_t uVar1;
  mddnode_t n_00;
  uint64_t uVar2;
  size_t sVar3;
  size_t sVar4;
  mddnode_t n;
  MDD mdd_local;
  
  if (mdd < 2) {
    mdd_local = 0;
  }
  else {
    n_00 = LDD_GETNODE(mdd);
    uVar1 = mddnode_getmark(n_00);
    if (uVar1 == '\0') {
      mddnode_setmark(n_00,'\x01');
      uVar2 = mddnode_getdown(n_00);
      sVar3 = lddmc_nodecount_mark(uVar2);
      uVar2 = mddnode_getright(n_00);
      sVar4 = lddmc_nodecount_mark(uVar2);
      mdd_local = sVar3 + 1 + sVar4;
    }
    else {
      mdd_local = 0;
    }
  }
  return mdd_local;
}

Assistant:

static size_t
lddmc_nodecount_mark(MDD mdd)
{
    if (mdd <= lddmc_true) return 0;
    mddnode_t n = LDD_GETNODE(mdd);
    if (mddnode_getmark(n)) return 0;
    mddnode_setmark(n, 1);
    return 1 + lddmc_nodecount_mark(mddnode_getdown(n)) + lddmc_nodecount_mark(mddnode_getright(n));
}